

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU.h
# Opt level: O3

void __thiscall
Eigen::
SparseLUMatrixUReturnType<Eigen::internal::MappedSuperNodalMatrix<double,int>,Eigen::MappedSparseMatrix<double,0,int>>
::solveInPlace<Eigen::Matrix<double,_1,3,0,_1,3>>
          (SparseLUMatrixUReturnType<Eigen::internal::MappedSuperNodalMatrix<double,int>,Eigen::MappedSparseMatrix<double,0,int>>
           *this,MatrixBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *X)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  PointerType pdVar12;
  long lVar13;
  char *__function;
  double *pdVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long local_a8;
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> U;
  
  if (-1 < (int)*(uint *)(*(long *)this + 8)) {
    iVar1 = *(int *)(X + 8);
    uVar9 = *(uint *)(*(long *)this + 8);
    do {
      lVar13 = *(long *)this;
      iVar2 = *(int *)(*(long *)(lVar13 + 0x38) + (ulong)uVar9 * 4);
      lVar19 = (long)iVar2;
      iVar10 = *(int *)(*(long *)(lVar13 + 0x18) + lVar19 * 4);
      iVar3 = *(int *)(*(long *)(lVar13 + 0x38) + 4 + (ulong)uVar9 * 4);
      pdVar12 = (PointerType)(iVar3 - lVar19);
      iVar11 = (int)pdVar12;
      if (iVar11 == 1) {
        if ((iVar2 < 0) || (lVar5 = *(long *)(X + 8), lVar5 <= lVar19)) {
LAB_0015809d:
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x151,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 3>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, 3>, Level = 1]"
                       );
        }
        lVar13 = *(long *)(lVar13 + 0x10);
        pdVar14 = (double *)(lVar19 * 8 + *(long *)X);
        lVar15 = 3;
        do {
          *pdVar14 = *pdVar14 / *(double *)(lVar13 + (long)iVar10 * 8);
          pdVar14 = pdVar14 + lVar5;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
      }
      else {
        if (*(int *)(*(long *)(lVar13 + 0x18) + 4 + lVar19 * 4) - iVar10 < 0) {
LAB_001580bc:
          __assert_fail("innerStride>=0 && outerStride>=0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Stride.h"
                        ,0x40,
                        "Eigen::Stride<-1, 0>::Stride(Index, Index) [_OuterStrideAtCompileTime = -1, _InnerStrideAtCompileTime = 0]"
                       );
        }
        if (iVar11 < 0 && *(long *)(lVar13 + 0x10) != 0) {
          __function = 
          "Eigen::MapBase<Eigen::Map<const Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Map<const Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>, Level = 0]"
          ;
LAB_00158107:
          __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/MapBase.h"
                        ,0x94,__function);
        }
        if ((iVar2 < 0) || (*(long *)(X + 8) <= lVar19)) goto LAB_0015809d;
        if ((long)iVar1 < 0) goto LAB_001580bc;
        local_a8 = lVar19 * 8 + *(long *)X;
        U.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value = 3;
        U.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = pdVar12;
        if ((iVar11 < 0) && (local_a8 != 0)) {
          __function = 
          "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, -1>, 0, Eigen::OuterStride<>>, Level = 0]"
          ;
          goto LAB_00158107;
        }
        U.m_stride.super_Stride<_1,_0>._8_8_ = *(long *)(lVar13 + 0x10) + (long)iVar10 * 8;
        U.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value = (long)iVar1;
        TriangularView<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>,2u>
        ::solveInPlace<1,Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>>
                  ((TriangularView<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>,2u>
                    *)&U.m_stride.super_Stride<_1,_0>.field_0x8,
                   (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    *)&local_a8);
      }
      iVar10 = iVar3;
      if (iVar3 < iVar2) {
        iVar10 = iVar2;
      }
      lVar13 = 0;
      do {
        if (iVar2 < iVar3) {
          lVar5 = *(long *)(this + 8);
          lVar15 = *(long *)(lVar5 + 0x10);
          lVar16 = lVar19;
          do {
            iVar11 = *(int *)(lVar15 + lVar16 * 4);
            lVar17 = (long)iVar11;
            iVar4 = *(int *)(lVar15 + 4 + lVar16 * 4);
            if (iVar11 < iVar4) {
              if ((lVar16 < 0) || (uVar6 = *(ulong *)(X + 8), (long)uVar6 <= lVar16))
              goto LAB_0015809d;
              lVar7 = *(long *)(lVar5 + 0x18);
              do {
                uVar20 = (ulong)*(int *)(lVar7 + lVar17 * 4);
                if (((long)uVar20 < 0) || (uVar6 <= uVar20)) goto LAB_0015809d;
                lVar18 = *(long *)X + uVar6 * lVar13 * 8;
                *(double *)(lVar18 + uVar20 * 8) =
                     *(double *)(lVar18 + uVar20 * 8) -
                     *(double *)(lVar18 + lVar16 * 8) *
                     *(double *)(*(long *)(lVar5 + 0x20) + lVar17 * 8);
                lVar17 = lVar17 + 1;
              } while (lVar17 < iVar4);
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != iVar10);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      bVar8 = 0 < (int)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar8);
  }
  return;
}

Assistant:

void solveInPlace(MatrixBase<Dest> &X) const
  {
    Index nrhs = X.cols();
    Index n = X.rows();
    // Backward solve with U
    for (Index k = m_mapL.nsuper(); k >= 0; k--)
    {
      Index fsupc = m_mapL.supToCol()[k];
      Index lda = m_mapL.colIndexPtr()[fsupc+1] - m_mapL.colIndexPtr()[fsupc]; // leading dimension
      Index nsupc = m_mapL.supToCol()[k+1] - fsupc;
      Index luptr = m_mapL.colIndexPtr()[fsupc];

      if (nsupc == 1)
      {
        for (Index j = 0; j < nrhs; j++)
        {
          X(fsupc, j) /= m_mapL.valuePtr()[luptr];
        }
      }
      else
      {
        Map<const Matrix<Scalar,Dynamic,Dynamic>, 0, OuterStride<> > A( &(m_mapL.valuePtr()[luptr]), nsupc, nsupc, OuterStride<>(lda) );
        Map< Matrix<Scalar,Dynamic,Dynamic>, 0, OuterStride<> > U (&(X(fsupc,0)), nsupc, nrhs, OuterStride<>(n) );
        U = A.template triangularView<Upper>().solve(U);
      }

      for (Index j = 0; j < nrhs; ++j)
      {
        for (Index jcol = fsupc; jcol < fsupc + nsupc; jcol++)
        {
          typename MatrixUType::InnerIterator it(m_mapU, jcol);
          for ( ; it; ++it)
          {
            Index irow = it.index();
            X(irow, j) -= X(jcol, j) * it.value();
          }
        }
      }
    } // End For U-solve
  }